

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_SetFloorPanning
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  sector_t_conflict *psVar1;
  uint uVar2;
  FSectorTagIterator local_30;
  double local_28;
  double local_20;
  
  if (arg0 == 0) {
    local_30.start = 0;
  }
  else {
    local_30.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_30.searchtag = arg0;
  uVar2 = FSectorTagIterator::Next(&local_30);
  if (-1 < (int)uVar2) {
    local_20 = (double)arg2 / 100.0 + (double)arg1;
    local_28 = (double)arg4 / 100.0 + (double)arg3;
    do {
      psVar1 = sectors;
      sectors[uVar2].planes[0].xform.xOffs = local_20;
      psVar1[uVar2].planes[0].xform.yOffs = local_28;
      uVar2 = FSectorTagIterator::Next(&local_30);
    } while (-1 < (int)uVar2);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFloorPanning)
// Sector_SetFloorPanning (tag, x-int, x-frac, y-int, y-frac)
{
	double xofs = arg1 + arg2 / 100.;
	double yofs = arg3 + arg4 / 100.;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetXOffset(sector_t::floor, xofs);
		sectors[secnum].SetYOffset(sector_t::floor, yofs);
	}
	return true;
}